

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

int lest::run<lest::test[3]>(test (*specification) [3],ostream *os)

{
  int iVar1;
  test *in_RCX;
  int iVar2;
  vector<lest::test,_std::allocator<lest::test>_> vStack_58;
  vector<lest::test,_std::allocator<lest::test>_> local_40;
  texts local_28;
  
  make<std::vector<lest::test,std::allocator<lest::test>>,lest::test>
            (&vStack_58,(lest *)specification,specification[1],in_RCX);
  std::ios_base::sync_with_stdio(false);
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_40,&vStack_58);
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = run(&local_40,&local_28,os);
  iVar2 = 0xff;
  if (iVar1 < 0xff) {
    iVar2 = iVar1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_40);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&vStack_58);
  return iVar2;
}

Assistant:

int run(  C const & specification, std::ostream & os = std::cout )
{
    return run( make_tests( specification ), os  );
}